

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          long param_2)

{
  long lVar1;
  void_pointer pvVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  __atomic_base<unsigned_long> _Var5;
  long v_2;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long v_1;
  _Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  _Var10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong max_align;
  ulong uVar14;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> v;
  allocator_base<std::allocator<unsigned_char>_> local_68;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *local_58;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  *pvStack_50;
  ulong local_48;
  poly_copy_descr local_38;
  
  lVar11 = *(long *)this;
  lVar1 = *(long *)(this + 0x10);
  uVar14 = (ulong)(*(long *)(this + 0x18) - lVar11) >> 4 & 0xfffffffffffffffe;
  uVar14 = uVar14 + (uVar14 == 0);
  max_align = 0x40;
  if (0x40 < *(ulong *)(this + 0x20)) {
    max_align = *(ulong *)(this + 0x20);
  }
  uVar12 = max_align;
  if (lVar11 != lVar1) {
    lVar13 = lVar11;
    do {
      uVar6 = *(long *)(lVar13 + 0x10) + (max_align - 1);
      uVar12 = (uVar12 - uVar6 % max_align) + uVar6;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != lVar1);
  }
  uVar7 = (max_align - (max_align + 0xff) % max_align) + 0xff;
  uVar6 = uVar7;
  if (lVar11 != lVar1) {
    lVar13 = lVar1 - lVar11 >> 5;
    uVar6 = (lVar13 + uVar12 + uVar7) / (lVar13 + 1U);
  }
  uVar8 = lVar1 - lVar11 >> 5;
  lVar11 = 0;
  if (uVar8 <= uVar14) {
    lVar11 = uVar14 - uVar8;
  }
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)0x0;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)0x0;
  local_68._storage =
       (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        *)0x0;
  local_68._end_storage = (void_pointer)0x0;
  local_48 = 8;
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::allocate
            (&local_68,uVar7 + uVar14 * 0x20 + uVar12 + lVar11 * uVar6);
  local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)local_68._storage;
  pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                *)((long)local_68._storage + uVar14 * 0x20);
  local_48 = max_align;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
  poly_uninitialized_copy
            (&local_38,&local_68,local_68._storage,*(elem_ptr_const_pointer *)this,
             *(elem_ptr_const_pointer *)(this + 0x10),*(elem_ptr_const_pointer *)this + uVar14,
             max_align);
  local_58 = local_38.
             super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
             .
             super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
             ._M_head_impl;
  pvStack_50 = local_38.
               super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
               ._M_head_impl;
  if ((local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl !=
       local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl) && (0x3f < local_48)) {
    _Var10._M_head_impl =
         local_38.
         super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
         .
         super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
         ._M_head_impl;
    if (local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
        ._M_head_impl !=
        (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
         *)local_68._storage) {
      _Var10._M_head_impl =
           (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
            *)((long)local_38.
                     super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                     .
                     super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                     ._M_head_impl[-1].ptr.first +
              local_38.
              super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
              .
              super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
              ._M_head_impl[-1].sf.first);
    }
    if ((void_pointer)
        ((long)_Var10._M_head_impl +
        (local_48 - ((long)_Var10._M_head_impl + (local_48 - 1)) % local_48) + 0xff) <=
        local_68._end_storage) {
      _Var10._M_head_impl =
           local_38.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
           ._M_head_impl;
      if (local_38.
          super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
          .
          super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
          ._M_head_impl !=
          (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
           *)local_68._storage) {
        _Var10._M_head_impl =
             (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
              *)((long)local_38.
                       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                       .
                       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                       ._M_head_impl[-1].ptr.first +
                local_38.
                super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                .
                super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                ._M_head_impl[-1].sf.first);
      }
      lVar11 = (local_48 - 1) - ((local_48 - 1) + (long)_Var10._M_head_impl) % local_48;
      *(undefined ***)((long)_Var10._M_head_impl + lVar11) = &PTR___cxa_pure_virtual_002bf808;
      LOCK();
      UNLOCK();
      _Var5._M_i = (Interface::last_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
      ((__atomic_base<unsigned_long> *)((long)_Var10._M_head_impl + lVar11 + 8))->_M_i =
           (__int_type)Interface::last_id.super___atomic_base<unsigned_long>._M_i;
      Interface::last_id.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
      *(undefined1 *)((long)_Var10._M_head_impl + lVar11 + 0x10) = 0;
      *(undefined ***)((long)_Var10._M_head_impl + lVar11) = &PTR_function_002bf840;
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x18) = *(undefined8 *)(param_2 + 0x18);
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x20) = *(undefined8 *)(param_2 + 0x20);
      *(undefined8 *)(param_2 + 0x18) = 0;
      *(undefined8 *)(param_2 + 0x20) = 0;
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x28) = *(undefined8 *)(param_2 + 0x28);
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x30) = *(undefined8 *)(param_2 + 0x30);
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x38) = *(undefined8 *)(param_2 + 0x38);
      *(undefined8 *)(param_2 + 0x28) = 0;
      *(undefined8 *)(param_2 + 0x30) = 0;
      *(undefined8 *)(param_2 + 0x38) = 8;
      *(undefined8 *)((long)_Var10._M_head_impl + lVar11 + 0x40) = *(undefined8 *)(param_2 + 0x40);
      *(undefined8 *)(param_2 + 0x40) = 0;
      *(undefined4 *)((long)_Var10._M_head_impl + lVar11 + 0x48) = 0xdeadbeef;
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->ptr).first = (Interface *)((long)_Var10._M_head_impl + lVar11);
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->ptr).second = (Interface *)((long)_Var10._M_head_impl + lVar11);
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->sf).first = 0x100;
      ((local_38.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl)->sf).second = 0x40;
      puVar9 = *(undefined8 **)this;
      *(void_pointer *)this = local_68._storage;
      pvVar2 = *(void_pointer *)(this + 8);
      *(void_pointer *)(this + 8) = local_68._end_storage;
      puVar3 = *(undefined8 **)(this + 0x10);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x10) =
           local_38.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
           ._M_head_impl + 1;
      pvStack_50 = *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                     **)(this + 0x18);
      *(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
        **)(this + 0x18) =
           local_38.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
           .
           super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
           ._M_head_impl;
      uVar4 = *(undefined8 *)(this + 0x20);
      *(ulong *)(this + 0x20) = local_48;
      local_68._storage = puVar9;
      local_68._end_storage = pvVar2;
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)puVar3;
      local_48 = uVar4;
      for (; puVar3 != puVar9; puVar9 = puVar9 + 4) {
        (**(code **)(*(long *)puVar9[1] + 0x18))();
        puVar9[2] = 0;
        puVar9[3] = 0;
        *puVar9 = 0;
        puVar9[1] = 0;
      }
      local_48 = 8;
      puVar9 = (undefined8 *)local_68._storage;
      if (0x1f < (ulong)((long)pvStack_50 - (long)local_68._storage)) {
        do {
          puVar9[2] = 0;
          puVar9[3] = 0;
          *puVar9 = 0;
          puVar9[1] = 0;
          puVar9 = puVar9 + 4;
        } while (puVar9 != (undefined8 *)
                           (((long)pvStack_50 - (long)local_68._storage & 0xffffffffffffffe0U) +
                           (long)local_68._storage));
      }
      local_58 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  *)0x0;
      pvStack_50 = (vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                    *)0x0;
      operator_delete(local_68._storage,(long)local_68._end_storage - (long)local_68._storage);
      local_68._storage = (void_pointer)0x0;
      local_68._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, std::allocator<Interface>, poly::virtual_cloning_policy>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::virtual_cloning_policy, T = Impl2T<poly::virtual_cloning_policy>, Args = <Impl2T<poly::virtual_cloning_policy>>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}